

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O2

int leave_span_callback(MD_SPANTYPE type,void *detail,void *userdata)

{
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  char *pcVar4;
  
  iVar1 = *(int *)((long)userdata + 0x14);
  if (type == MD_SPAN_IMG) {
    iVar1 = iVar1 + -1;
    *(int *)((long)userdata + 0x14) = iVar1;
  }
  if (0 < iVar1) {
    return 0;
  }
  switch(type) {
  case MD_SPAN_EM:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</em>";
    iVar1 = 5;
    break;
  case MD_SPAN_STRONG:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</strong>";
    iVar1 = 9;
    break;
  case MD_SPAN_A:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</a>";
    goto LAB_0010d7bd;
  case MD_SPAN_IMG:
    if (*(long *)((long)detail + 0x20) != 0) {
      (**userdata)("\" title=\"",9,*(undefined8 *)((long)userdata + 8));
      render_attribute((MD_HTML *)userdata,(MD_ATTRIBUTE *)((long)detail + 0x20),render_html_escaped
                      );
    }
    uVar3 = *(uint *)((long)userdata + 0x10) & 8;
    pcVar4 = "\" />";
    if (uVar3 == 0) {
      pcVar4 = "\">";
    }
    iVar1 = (uVar3 >> 2) + 2;
    uVar2 = *(undefined8 *)((long)userdata + 8);
    break;
  case MD_SPAN_CODE:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</code>";
    iVar1 = 7;
    break;
  case MD_SPAN_DEL:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</del>";
    iVar1 = 6;
    break;
  case MD_SPAN_LATEXMATH:
  case MD_SPAN_LATEXMATH_DISPLAY:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</x-equation>";
    goto LAB_0010d84d;
  case MD_SPAN_WIKILINK:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</x-wikilink>";
LAB_0010d84d:
    iVar1 = 0xd;
    break;
  case MD_SPAN_U:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</u>";
LAB_0010d7bd:
    iVar1 = 4;
    break;
  default:
    goto switchD_0010d781_default;
  }
  (**userdata)(pcVar4,iVar1,uVar2);
switchD_0010d781_default:
  return 0;
}

Assistant:

static int
leave_span_callback(MD_SPANTYPE type, void* detail, void* userdata)
{
    MD_HTML* r = (MD_HTML*) userdata;

    if(type == MD_SPAN_IMG)
        r->image_nesting_level--;
    if(r->image_nesting_level > 0)
        return 0;

    switch(type) {
        case MD_SPAN_EM:                RENDER_VERBATIM(r, "</em>"); break;
        case MD_SPAN_STRONG:            RENDER_VERBATIM(r, "</strong>"); break;
        case MD_SPAN_U:                 RENDER_VERBATIM(r, "</u>"); break;
        case MD_SPAN_A:                 RENDER_VERBATIM(r, "</a>"); break;
        case MD_SPAN_IMG:               render_close_img_span(r, (MD_SPAN_IMG_DETAIL*) detail); break;
        case MD_SPAN_CODE:              RENDER_VERBATIM(r, "</code>"); break;
        case MD_SPAN_DEL:               RENDER_VERBATIM(r, "</del>"); break;
        case MD_SPAN_LATEXMATH:         /*fall through*/
        case MD_SPAN_LATEXMATH_DISPLAY: RENDER_VERBATIM(r, "</x-equation>"); break;
        case MD_SPAN_WIKILINK:          RENDER_VERBATIM(r, "</x-wikilink>"); break;
    }

    return 0;
}